

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

int SHA256_Update(SHA256_CTX *c,void *data,size_t len)

{
  ulong uVar1;
  uint uVar2;
  SHA256_CTX *in_RAX;
  SHA256_CTX *extraout_RAX;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha2_byte *data_local;
  SHA256_CTX *context_local;
  
  if (len != 0) {
    if ((c == (SHA256_CTX *)0x0) || (data == (void *)0x0)) {
      __assert_fail("context != (SHA256_CTX*)0 && data != (sha2_byte*)0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c"
                    ,0x20e,"void SHA256_Update(SHA256_CTX *, const sha2_byte *, size_t)");
    }
    uVar1._0_4_ = c->Nl;
    uVar1._4_4_ = c->Nh;
    in_RAX = (SHA256_CTX *)(uVar1 >> 3 & 0x3f);
    _usedspace = len;
    len_local = (size_t)data;
    if ((int)in_RAX != 0) {
      uVar2 = 0x40 - (int)in_RAX;
      if (len < uVar2) {
        memcpy((void *)((long)c->data + (long)in_RAX),data,len);
        *(size_t *)&c->Nl = len * 8 + *(long *)&c->Nl;
        in_RAX = c;
        goto LAB_0014108e;
      }
      memcpy((void *)((long)c->data + (long)in_RAX),data,(ulong)uVar2);
      *(ulong *)&c->Nl = (ulong)(uVar2 * 8) + *(long *)&c->Nl;
      _usedspace = len - uVar2;
      len_local = (long)data + (ulong)uVar2;
      SHA256_Transform((SHA256_CTX *)c,c->data);
      in_RAX = extraout_RAX;
    }
    for (; 0x3f < _usedspace; _usedspace = _usedspace - 0x40) {
      SHA256_Transform((SHA256_CTX *)c,(sha2_word32 *)len_local);
      *(long *)&c->Nl = *(long *)&c->Nl + 0x200;
      in_RAX = (SHA256_CTX *)(len_local + 0x40);
      len_local = (size_t)in_RAX;
    }
    if (_usedspace != 0) {
      memcpy(c->data,(void *)len_local,_usedspace);
      *(size_t *)&c->Nl = _usedspace * 8 + *(long *)&c->Nl;
      in_RAX = c;
    }
  }
LAB_0014108e:
  return (int)in_RAX;
}

Assistant:

void SHA256_Update(SHA256_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0 && data != (sha2_byte*)0);

	usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA256_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, freespace);
			context->bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
			SHA256_Transform(context, (sha2_word32*)context->buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->buffer[usedspace], data, len);
			context->bitcount += len << 3;
			return;
		}
	}
	while (len >= SHA256_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		SHA256_Transform(context, (sha2_word32*)data);
		context->bitcount += SHA256_BLOCK_LENGTH << 3;
		len -= SHA256_BLOCK_LENGTH;
		data += SHA256_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		context->bitcount += len << 3;
	}
}